

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

bool DecodeBase64PSBT(PartiallySignedTransaction *psbt,string *base64_tx,string *error)

{
  bool bVar1;
  long in_FS_OFFSET;
  string_view str;
  Span<const_std::byte> tx_data_00;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> tx_data;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> local_40;
  char local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = (base64_tx->_M_dataplus)._M_p;
  str._M_len = base64_tx->_M_string_length;
  DecodeBase64((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               &local_40._M_value,str);
  if (local_28 == '\0') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (error,"invalid base64");
    bVar1 = false;
  }
  else {
    tx_data_00.m_size =
         (long)local_40._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish - local_40._0_8_;
    tx_data_00.m_data =
         local_40._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_start;
    bVar1 = DecodeRawPSBT(psbt,tx_data_00,error);
  }
  std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::_M_reset
            ((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             &local_40._M_value);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DecodeBase64PSBT(PartiallySignedTransaction& psbt, const std::string& base64_tx, std::string& error)
{
    auto tx_data = DecodeBase64(base64_tx);
    if (!tx_data) {
        error = "invalid base64";
        return false;
    }
    return DecodeRawPSBT(psbt, MakeByteSpan(*tx_data), error);
}